

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::clicked(QColumnViewPrivate *this,QModelIndex *index)

{
  bool bVar1;
  QModelIndex *rhs;
  qsizetype qVar2;
  reference ppQVar3;
  QItemSelectionModel *pQVar4;
  ulong uVar5;
  undefined8 in_RSI;
  QColumnViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int column;
  QAbstractItemView *columnClicked;
  QColumnView *q;
  SelectionFlags flags;
  QModelIndex parent;
  SelectionFlag flags_00;
  int local_64;
  QModelIndex *in_stack_ffffffffffffffa0;
  QAbstractItemView *pQVar6;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> local_3c [7];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent(in_stack_ffffffffffffffa0);
  pQVar6 = (QAbstractItemView *)0x0;
  local_64 = 0;
  do {
    rhs = (QModelIndex *)(long)local_64;
    qVar2 = QList<QAbstractItemView_*>::size(&in_RDI->columns);
    if (qVar2 <= (long)rhs) {
LAB_00864b08:
      flags_00 = (SelectionFlag)((ulong)rhs >> 0x20);
      pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_RDI);
      if ((pQVar4 != (QItemSelectionModel *)0x0) && (pQVar6 != (QAbstractItemView *)0x0)) {
        local_3c[0].i = 0xaaaaaaaa;
        QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                  ((QFlags<QItemSelectionModel::SelectionFlag> *)in_RDI,flags_00);
        pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_RDI);
        uVar5 = QItemSelectionModel::isSelected((QModelIndex *)pQVar4);
        if ((uVar5 & 1) != 0) {
          QFlags<QItemSelectionModel::SelectionFlag>::operator|=
                    ((QFlags<QItemSelectionModel::SelectionFlag> *)local_3c,Select);
        }
        pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_RDI);
        (**(code **)(*(long *)pQVar4 + 0x60))(pQVar4,in_RSI,local_3c[0].i);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<QAbstractItemView_*>::at((QList<QAbstractItemView_*> *)in_RDI,(qsizetype)rhs);
    QAbstractItemView::rootIndex((QAbstractItemView *)in_RDI);
    bVar1 = ::operator==((QModelIndex *)in_RDI,rhs);
    if (bVar1) {
      ppQVar3 = QList<QAbstractItemView_*>::operator[]
                          ((QList<QAbstractItemView_*> *)in_RDI,(qsizetype)rhs);
      pQVar6 = *ppQVar3;
      goto LAB_00864b08;
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

void QColumnViewPrivate::clicked(const QModelIndex &index)
{
    Q_Q(QColumnView);
    QModelIndex parent = index.parent();
    QAbstractItemView *columnClicked = nullptr;
    for (int column = 0; column < columns.size(); ++column) {
        if (columns.at(column)->rootIndex() == parent) {
            columnClicked = columns[column];
            break;
        }
    }
    if (q->selectionModel() && columnClicked) {
        QItemSelectionModel::SelectionFlags flags = QItemSelectionModel::Current;
        if (columnClicked->selectionModel()->isSelected(index))
            flags |= QItemSelectionModel::Select;
        q->selectionModel()->setCurrentIndex(index, flags);
    }
}